

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O1

int Abc_NtkFinCheckTypesOk(Abc_Ntk_t *pNtk)

{
  void **ppvVar1;
  Abc_Obj_t *pNode;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = (long)pNtk->vObjs->nSize;
  if (0 < lVar4) {
    ppvVar1 = pNtk->vObjs->pArray;
    lVar3 = 0;
    do {
      pNode = (Abc_Obj_t *)ppvVar1[lVar3];
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        iVar2 = Abc_ObjFinGateType(pNode);
        if (iVar2 == -100) goto LAB_002b41b8;
      }
      lVar3 = lVar3 + 1;
    } while (lVar4 != lVar3);
  }
  lVar3 = 0;
LAB_002b41b8:
  return (int)lVar3;
}

Assistant:

int Abc_NtkFinCheckTypesOk( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj; int i;
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( Abc_ObjFinGateType(pObj) == ABC_FIN_NONE )
            return i;
    return 0;
}